

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyBlobAppend(SyBlob *pBlob,void *pData,sxu32 nSize)

{
  sxu32 sVar1;
  void *pvVar2;
  sxu32 sVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if (nSize == 0) {
    return 0;
  }
  uVar4 = pBlob->nFlags;
  if ((uVar4 & 3) == 0) {
    if ((uVar4 & 4) == 0) {
      sVar3 = pBlob->nByte;
      sVar1 = pBlob->mByte;
    }
    else {
      if (pBlob->nByte == 0) {
        pBlob->pBlob = (void *)0x0;
        pBlob->mByte = 0;
        sVar3 = 0;
      }
      else {
        pvVar2 = SyMemBackendDup(pBlob->pAllocator,pBlob->pBlob,pBlob->nByte);
        if (pvVar2 == (void *)0x0) {
          return -1;
        }
        pBlob->pBlob = pvVar2;
        sVar3 = pBlob->nByte;
        uVar4 = pBlob->nFlags;
        pBlob->mByte = sVar3;
      }
      pBlob->nFlags = uVar4 & 0xfffffffb;
      sVar1 = sVar3;
    }
    if (sVar1 - sVar3 < nSize) {
      if (sVar1 == 0) {
        sVar3 = 0x10;
        if (0x10 < nSize) {
          sVar3 = nSize;
        }
      }
      else {
        sVar3 = nSize + sVar1 * 2 + 0x10;
      }
      pvVar2 = SyMemBackendRealloc(pBlob->pAllocator,pBlob->pBlob,sVar3);
      if (pvVar2 == (void *)0x0) {
        return -1;
      }
      pBlob->pBlob = pvVar2;
      pBlob->mByte = sVar3;
    }
  }
  else {
    uVar4 = pBlob->mByte - pBlob->nByte;
    if ((uVar4 < nSize) && (nSize = uVar4, pBlob->mByte == pBlob->nByte)) {
      return -0x1d;
    }
  }
  if (pData != (void *)0x0) {
    pvVar2 = pBlob->pBlob;
    uVar4 = pBlob->nByte;
    pBlob->nByte = uVar4 + nSize;
    if (nSize != 0) {
      lVar6 = 0;
      do {
        *(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar4) = *(undefined1 *)((long)pData + lVar6);
        iVar5 = (int)lVar6;
        if (nSize - 1 == iVar5) {
          return 0;
        }
        *(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar4 + 1) =
             *(undefined1 *)((long)pData + lVar6 + 1);
        if (nSize - 2 == iVar5) {
          return 0;
        }
        *(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar4 + 2) =
             *(undefined1 *)((long)pData + lVar6 + 2);
        if (nSize - 3 == iVar5) {
          return 0;
        }
        *(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar4 + 3) =
             *(undefined1 *)((long)pData + lVar6 + 3);
        lVar6 = lVar6 + 4;
      } while (nSize != (sxu32)lVar6);
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobAppend(SyBlob *pBlob, const void *pData, sxu32 nSize)
{
	sxu8 *zBlob;
	sxi32 rc;
	if( nSize < 1 ){
		return SXRET_OK;
	}
	rc = BlobPrepareGrow(&(*pBlob), &nSize);
	if( SXRET_OK != rc ){
		return rc;
	}
	if( pData ){
		zBlob = (sxu8 *)pBlob->pBlob ;
		zBlob = &zBlob[pBlob->nByte];
		pBlob->nByte += nSize;
		SX_MACRO_FAST_MEMCPY(pData, zBlob, nSize);
	}
	return SXRET_OK;
}